

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O0

Aig_Man_t *
createMonotoneTester
          (Aig_Man_t *pAig,aigPoIndices *aigPoIndicesArg,monotoneVectorsStruct *monotoneVectorArg,
          int *startMonotonePropPo)

{
  Vec_Int_t *vKnownMonotone;
  Vec_Int_t *vCandMonotone;
  Vec_Int_t *p;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Aig_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *pAVar10;
  void *pvVar11;
  Vec_Ptr_t *pVVar12;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar13;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Aig_Obj_t *local_1a8;
  Aig_Obj_t *local_170;
  Aig_Obj_t *local_150;
  Vec_Int_t *vHintMonotoneLocal;
  Vec_Int_t *vCandMonotoneLocal;
  Vec_Int_t *vKnownMonotoneLocal;
  int hintSingalBeginningMarkerLocal;
  int pendingSignalIndexLocal;
  Vec_Ptr_t *vHintMonotoneLocalProp;
  Vec_Ptr_t *vHintMonotoneLocalFlopOutput;
  Vec_Ptr_t *vHintMonotoneLocalDriverNew;
  Aig_Obj_t *pObjKnownMonotoneAnd;
  Aig_Obj_t *pObjTemp2;
  Aig_Obj_t *pObjTemp1;
  Aig_Obj_t *pHintMonotoneFlop;
  Aig_Obj_t *pHintSignalLo;
  Aig_Obj_t *pPendingFlop;
  Aig_Obj_t *pObjPendingAndNextPending;
  Aig_Obj_t *pObjPendingDriverNew;
  Aig_Obj_t *pObjDriverNew;
  Aig_Obj_t *pObjDriver;
  Aig_Obj_t *pObjPo;
  Aig_Obj_t *pObj;
  uint local_60;
  int poCreated;
  int poCopied;
  int loCreated;
  int loCopied;
  int liCreated;
  int liCopied;
  int piCopied;
  int iElemHint;
  int poSerialNum;
  int oldPoNum;
  int nRegCount;
  int i;
  int iElem;
  Aig_Man_t *pNewAig;
  int *startMonotonePropPo_local;
  monotoneVectorsStruct *monotoneVectorArg_local;
  aigPoIndices *aigPoIndicesArg_local;
  Aig_Man_t *pAig_local;
  
  loCopied = 0;
  poCopied = 0;
  local_60 = 0;
  pObj._4_4_ = 0;
  iVar4 = aigPoIndicesArg->attrPendingSignalIndex;
  iVar5 = aigPoIndicesArg->attrHintSingalBeginningMarker;
  vKnownMonotone = monotoneVectorArg->attrKnownMonotone;
  vCandMonotone = monotoneVectorArg->attrCandMonotone;
  p = monotoneVectorArg->attrHintMonotone;
  iVar1 = Aig_ManObjNumMax(pAig);
  p_00 = Aig_ManStart(iVar1);
  sVar7 = strlen(pAig->pName);
  pcVar8 = (char *)malloc(sVar7 + 10);
  p_00->pName = pcVar8;
  sprintf(p_00->pName,"%s_%s",pAig->pName,"_monotone");
  p_00->pSpec = (char *)0x0;
  pAVar9 = Aig_ManConst1(pAig);
  pAVar10 = Aig_ManConst1(p_00);
  (pAVar9->field_5).pData = pAVar10;
  for (oldPoNum = 0; iVar1 = Saig_ManPiNum(pAig), oldPoNum < iVar1; oldPoNum = oldPoNum + 1) {
    pvVar11 = Vec_PtrEntry(pAig->vCis,oldPoNum);
    pAVar9 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar11 + 0x28) = pAVar9;
  }
  for (oldPoNum = 0; iVar1 = Saig_ManRegNum(pAig), oldPoNum < iVar1; oldPoNum = oldPoNum + 1) {
    pVVar12 = pAig->vCis;
    iVar1 = Saig_ManPiNum(pAig);
    pvVar11 = Vec_PtrEntry(pVVar12,oldPoNum + iVar1);
    poCopied = poCopied + 1;
    pAVar9 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar11 + 0x28) = pAVar9;
  }
  poCreated = 1;
  pAVar9 = Aig_ObjCreateCi(p_00);
  iVar1 = Vec_IntSize(p);
  pVVar12 = Vec_PtrAlloc(iVar1);
  for (oldPoNum = 0; iVar1 = Vec_IntSize(p), oldPoNum < iVar1; oldPoNum = oldPoNum + 1) {
    Vec_IntEntry(p,oldPoNum);
    poCreated = poCreated + 1;
    pAVar10 = Aig_ObjCreateCi(p_00);
    Vec_PtrPush(pVVar12,pAVar10);
  }
  printf("\nnRegCount = %d\n",(ulong)(uint)(poCreated + poCopied));
  for (oldPoNum = 0; iVar1 = Vec_PtrSize(pAig->vObjs), oldPoNum < iVar1; oldPoNum = oldPoNum + 1) {
    pAVar10 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,oldPoNum);
    if ((pAVar10 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar10), iVar1 != 0)) {
      pAVar13 = Aig_ObjChild0Copy(pAVar10);
      p1 = Aig_ObjChild1Copy(pAVar10);
      pAVar13 = Aig_And(p_00,pAVar13,p1);
      (pAVar10->field_5).pData = pAVar13;
    }
  }
  pAVar10 = Aig_ManCo(pAig,iVar4);
  pAVar13 = Aig_ObjFanin0(pAVar10);
  iVar1 = Aig_ObjFaninC0(pAVar10);
  pAVar10 = Aig_NotCond(pAVar13,iVar1);
  iVar1 = Aig_IsComplement(pAVar10);
  if (iVar1 == 0) {
    pAVar10 = Aig_Regular(pAVar10);
    local_150 = (Aig_Obj_t *)(pAVar10->field_5).pData;
  }
  else {
    pAVar10 = Aig_Regular(pAVar10);
    local_150 = Aig_Not((Aig_Obj_t *)(pAVar10->field_5).pData);
  }
  pPendingFlop = Aig_And(p_00,local_150,pAVar9);
  iVar1 = Aig_ManCoNum(pAig);
  iVar2 = Aig_ManRegNum(pAig);
  vHintMonotoneLocalDriverNew = (Vec_Ptr_t *)Aig_ManConst1(p_00);
  if (vKnownMonotone != (Vec_Int_t *)0x0) {
    iVar3 = checkSanityOfKnownMonotone(vKnownMonotone,vCandMonotone,p);
    if (iVar3 == 0) {
      __assert_fail("checkSanityOfKnownMonotone( vKnownMonotoneLocal, vCandMonotoneLocal, vHintMonotoneLocal )"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/monotone.c"
                    ,0xf4,
                    "Aig_Man_t *createMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct monotoneVectorsStruct *, int *)"
                   );
    }
    for (oldPoNum = 0; iVar3 = Vec_IntSize(vKnownMonotone), oldPoNum < iVar3;
        oldPoNum = oldPoNum + 1) {
      iVar3 = Vec_IntEntry(vKnownMonotone,oldPoNum);
      uVar6 = (iVar3 - iVar5) + 1 + iVar4;
      printf("\nProcessing knownMonotone = %d\n",(ulong)uVar6);
      pAVar9 = Aig_ManCo(pAig,uVar6);
      pAVar10 = Aig_ObjFanin0(pAVar9);
      iVar3 = Aig_ObjFaninC0(pAVar9);
      pAVar9 = Aig_NotCond(pAVar10,iVar3);
      iVar3 = Aig_IsComplement(pAVar9);
      if (iVar3 == 0) {
        pAVar9 = Aig_Regular(pAVar9);
        local_170 = (Aig_Obj_t *)(pAVar9->field_5).pData;
      }
      else {
        pAVar9 = Aig_Regular(pAVar9);
        local_170 = Aig_Not((Aig_Obj_t *)(pAVar9->field_5).pData);
      }
      pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(pVVar12,uVar6 - (iVar1 - iVar2));
      pAVar10 = Aig_And(p_00,local_170,pAVar9);
      pAVar13 = Aig_Not(local_170);
      pAVar9 = Aig_Not(pAVar9);
      pAVar9 = Aig_And(p_00,pAVar13,pAVar9);
      pAVar9 = Aig_Or(p_00,pAVar10,pAVar9);
      vHintMonotoneLocalDriverNew =
           (Vec_Ptr_t *)Aig_And(p_00,(Aig_Obj_t *)vHintMonotoneLocalDriverNew,pAVar9);
    }
    pPendingFlop = Aig_And(p_00,pPendingFlop,(Aig_Obj_t *)vHintMonotoneLocalDriverNew);
  }
  iVar4 = Vec_IntSize(p);
  p_01 = Vec_PtrAlloc(iVar4);
  iVar4 = Vec_IntSize(p);
  p_02 = Vec_PtrAlloc(iVar4);
  for (oldPoNum = 0; iVar4 = Vec_IntSize(p), oldPoNum < iVar4; oldPoNum = oldPoNum + 1) {
    iVar4 = Vec_IntEntry(p,oldPoNum);
    pAVar9 = Aig_ManCo(pAig,iVar4);
    pAVar10 = Aig_ObjFanin0(pAVar9);
    iVar5 = Aig_ObjFaninC0(pAVar9);
    pAVar9 = Aig_NotCond(pAVar10,iVar5);
    iVar5 = Aig_IsComplement(pAVar9);
    if (iVar5 == 0) {
      pAVar9 = Aig_Regular(pAVar9);
      local_1a8 = (Aig_Obj_t *)(pAVar9->field_5).pData;
    }
    else {
      pAVar9 = Aig_Regular(pAVar9);
      local_1a8 = Aig_Not((Aig_Obj_t *)(pAVar9->field_5).pData);
    }
    if ((vKnownMonotone == (Vec_Int_t *)0x0) ||
       (iVar5 = Vec_IntFind(vKnownMonotone,iVar4), iVar5 == -1)) {
      iVar4 = Vec_IntFind(p,iVar4);
      pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(pVVar12,iVar4);
      pAVar9 = Aig_And(p_00,pPendingFlop,pAVar9);
      pAVar9 = Aig_Not(pAVar9);
      pAVar9 = Aig_Or(p_00,pAVar9,local_1a8);
      Vec_PtrPush(p_01,local_1a8);
      Vec_PtrPush(p_02,pAVar9);
    }
    else {
      Vec_PtrPush(p_01,local_1a8);
    }
  }
  for (oldPoNum = 0; iVar4 = Saig_ManPoNum(pAig), oldPoNum < iVar4; oldPoNum = oldPoNum + 1) {
    pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,oldPoNum);
    local_60 = local_60 + 1;
    pAVar10 = Aig_ObjChild0Copy(pAVar9);
    pAVar10 = Aig_ObjCreateCo(p_00,pAVar10);
    (pAVar9->field_5).pData = pAVar10;
  }
  *startMonotonePropPo = oldPoNum;
  for (oldPoNum = 0; iVar4 = Vec_PtrSize(p_02), oldPoNum < iVar4; oldPoNum = oldPoNum + 1) {
    pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(p_02,oldPoNum);
    pObj._4_4_ = pObj._4_4_ + 1;
    Aig_ObjCreateCo(p_00,pAVar9);
  }
  for (oldPoNum = 0; iVar4 = Saig_ManRegNum(pAig), oldPoNum < iVar4; oldPoNum = oldPoNum + 1) {
    pVVar12 = pAig->vCos;
    iVar4 = Saig_ManPoNum(pAig);
    pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(pVVar12,oldPoNum + iVar4);
    loCopied = loCopied + 1;
    pAVar9 = Aig_ObjChild0Copy(pAVar9);
    Aig_ObjCreateCo(p_00,pAVar9);
  }
  loCreated = 1;
  Aig_ObjCreateCo(p_00,local_150);
  for (oldPoNum = 0; iVar4 = Vec_PtrSize(p_01), oldPoNum < iVar4; oldPoNum = oldPoNum + 1) {
    pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(p_01,oldPoNum);
    loCreated = loCreated + 1;
    Aig_ObjCreateCo(p_00,pAVar9);
  }
  printf("\npoCopied = %d, poCreated = %d\n",(ulong)local_60,(ulong)pObj._4_4_);
  printf("\nliCreated++ = %d\n",(ulong)(uint)loCreated);
  Aig_ManSetRegNum(p_00,poCreated + poCopied);
  Aig_ManCleanup(p_00);
  iVar4 = Aig_ManCheck(p_00);
  if (iVar4 != 0) {
    if (poCopied + poCreated == loCopied + loCreated) {
      uVar6 = Saig_ManPoNum(p_00);
      printf("\nSaig_ManPoNum = %d\n",(ulong)uVar6);
      return p_00;
    }
    __assert_fail("loCopied + loCreated == liCopied + liCreated",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/monotone.c"
                  ,0x155,
                  "Aig_Man_t *createMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct monotoneVectorsStruct *, int *)"
                 );
  }
  __assert_fail("Aig_ManCheck( pNewAig )",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/monotone.c"
                ,0x154,
                "Aig_Man_t *createMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct monotoneVectorsStruct *, int *)"
               );
}

Assistant:

Aig_Man_t *createMonotoneTester(Aig_Man_t *pAig, struct aigPoIndices *aigPoIndicesArg, struct monotoneVectorsStruct *monotoneVectorArg, int *startMonotonePropPo)
{
	Aig_Man_t *pNewAig;
	int iElem, i, nRegCount, oldPoNum, poSerialNum, iElemHint;
	int piCopied = 0, liCopied = 0, liCreated = 0, loCopied = 0, loCreated = 0;
	int poCopied = 0, poCreated = 0;
	Aig_Obj_t *pObj, *pObjPo, *pObjDriver, *pObjDriverNew, *pObjPendingDriverNew, *pObjPendingAndNextPending;
	Aig_Obj_t *pPendingFlop, *pHintSignalLo, *pHintMonotoneFlop, *pObjTemp1, *pObjTemp2, *pObjKnownMonotoneAnd;
	Vec_Ptr_t *vHintMonotoneLocalDriverNew;
	Vec_Ptr_t *vHintMonotoneLocalFlopOutput;
	Vec_Ptr_t *vHintMonotoneLocalProp;

	int pendingSignalIndexLocal = aigPoIndicesArg->attrPendingSignalIndex;
	int hintSingalBeginningMarkerLocal = aigPoIndicesArg->attrHintSingalBeginningMarker;
	//int hintSingalEndMarkerLocal = aigPoIndicesArg->attrHintSingalEndMarker;

	Vec_Int_t *vKnownMonotoneLocal = monotoneVectorArg->attrKnownMonotone;
	Vec_Int_t *vCandMonotoneLocal = monotoneVectorArg->attrCandMonotone;
	Vec_Int_t *vHintMonotoneLocal = monotoneVectorArg->attrHintMonotone;
	
	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_monotone") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "_monotone");
    	pNewAig->pSpec = NULL;

	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//****************************************************************
    	// Step 3: create true PIs
	//****************************************************************
    	Saig_ManForEachPi( pAig, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
	}

	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
    	}

	//****************************************************************
	// Step 6: create "D" register output for PENDING flop 
	//****************************************************************
	loCreated++;
	pPendingFlop = Aig_ObjCreateCi( pNewAig );

	//****************************************************************
	// Step 6.a: create "D" register output for HINT_MONOTONE flop 
	//****************************************************************
	vHintMonotoneLocalFlopOutput = Vec_PtrAlloc(Vec_IntSize(vHintMonotoneLocal));
	Vec_IntForEachEntry( vHintMonotoneLocal, iElem, i )
	{
		loCreated++;
		pHintMonotoneFlop = Aig_ObjCreateCi( pNewAig );
		Vec_PtrPush( vHintMonotoneLocalFlopOutput, pHintMonotoneFlop );
	}

	nRegCount = loCreated + loCopied;
	printf("\nnRegCount = %d\n", nRegCount);

	//********************************************************************
	// Step 7: create internal nodes
	//********************************************************************
    	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}
	
	//********************************************************************
	// Step 8: mapping appropriate new flop drivers 
	//********************************************************************

	pObjPo = Aig_ManCo( pAig, pendingSignalIndexLocal );
	pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
	pObjPendingDriverNew = !Aig_IsComplement(pObjDriver)? 
				(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
				Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));

	pObjPendingAndNextPending = Aig_And( pNewAig, pObjPendingDriverNew, pPendingFlop );

	oldPoNum = Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig);
	pObjKnownMonotoneAnd = Aig_ManConst1( pNewAig );
	#if 1
	if( vKnownMonotoneLocal )
	{
		assert( checkSanityOfKnownMonotone( vKnownMonotoneLocal, vCandMonotoneLocal, vHintMonotoneLocal ) );

		Vec_IntForEachEntry( vKnownMonotoneLocal, iElemHint, i )
		{
			iElem = (iElemHint - hintSingalBeginningMarkerLocal) + 1 + pendingSignalIndexLocal;
			printf("\nProcessing knownMonotone = %d\n", iElem);
			pObjPo = Aig_ManCo( pAig, iElem );
			pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
			pObjDriverNew = !Aig_IsComplement(pObjDriver)? 
					(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
					Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));
			pHintSignalLo = (Aig_Obj_t *)Vec_PtrEntry(vHintMonotoneLocalFlopOutput, iElem - oldPoNum);
			pObjTemp1 = Aig_Or( pNewAig, Aig_And(pNewAig, pObjDriverNew, pHintSignalLo), 
						Aig_And(pNewAig, Aig_Not(pObjDriverNew), Aig_Not(pHintSignalLo)) );
			
			pObjKnownMonotoneAnd = Aig_And( pNewAig, pObjKnownMonotoneAnd, pObjTemp1 );
		}
		pObjPendingAndNextPending = Aig_And( pNewAig, pObjPendingAndNextPending, pObjKnownMonotoneAnd );
	}
	#endif

	vHintMonotoneLocalDriverNew = Vec_PtrAlloc(Vec_IntSize(vHintMonotoneLocal));
	vHintMonotoneLocalProp = Vec_PtrAlloc(Vec_IntSize(vHintMonotoneLocal));
	Vec_IntForEachEntry( vHintMonotoneLocal, iElem, i )
	{
		pObjPo = Aig_ManCo( pAig, iElem );
		pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
		pObjDriverNew = !Aig_IsComplement(pObjDriver)? 
				(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
				Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));

		if( vKnownMonotoneLocal != NULL && Vec_IntFind( vKnownMonotoneLocal, iElem ) != -1 )
		{
			Vec_PtrPush(vHintMonotoneLocalDriverNew, pObjDriverNew);
		}
		else
		{
			poSerialNum = Vec_IntFind( vHintMonotoneLocal, iElem );
			pHintSignalLo = (Aig_Obj_t *)Vec_PtrEntry(vHintMonotoneLocalFlopOutput, poSerialNum );
			pObjTemp1 = Aig_And( pNewAig, pObjPendingAndNextPending, pHintSignalLo);
			pObjTemp2 = Aig_Or( pNewAig, Aig_Not(pObjTemp1), pObjDriverNew );
			//pObjTemp2 = Aig_Or( pNewAig, Aig_Not(pObjTemp1), Aig_ManConst1( pNewAig ));
			//pObjTemp2 = Aig_ManConst1( pNewAig );
			Vec_PtrPush(vHintMonotoneLocalDriverNew, pObjDriverNew);
			Vec_PtrPush(vHintMonotoneLocalProp, pObjTemp2); 
		}
	}

	//********************************************************************
	// Step 9: create primary outputs 
	//********************************************************************
	Saig_ManForEachPo( pAig, pObj, i )
	{
		poCopied++;
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	*startMonotonePropPo = i;
	Vec_PtrForEachEntry( Aig_Obj_t *, vHintMonotoneLocalProp, pObj, i )
	{
		poCreated++;
		pObjPo = Aig_ObjCreateCo( pNewAig, pObj ); 
	}

	//********************************************************************
	// Step 9: create latch inputs 
	//********************************************************************

	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}
	
	//********************************************************************
	// Step 9.a: create latch input for PENDING_FLOP
	//********************************************************************

	liCreated++;
	Aig_ObjCreateCo( pNewAig, pObjPendingDriverNew );

	//********************************************************************
	// Step 9.b: create latch input for MONOTONE_FLOP
	//********************************************************************

	Vec_PtrForEachEntry( Aig_Obj_t *, vHintMonotoneLocalDriverNew, pObj, i )
	{
		liCreated++;
		Aig_ObjCreateCo( pNewAig, pObj );
	}

	printf("\npoCopied = %d, poCreated = %d\n", poCopied, poCreated);
	printf("\nliCreated++ = %d\n", liCreated );
	Aig_ManSetRegNum( pNewAig, nRegCount );
	Aig_ManCleanup( pNewAig );
	
	assert( Aig_ManCheck( pNewAig ) );
	assert( loCopied + loCreated == liCopied + liCreated );

	printf("\nSaig_ManPoNum = %d\n", Saig_ManPoNum(pNewAig));
	return pNewAig;
}